

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O1

void __thiscall
cpp_bindgen::cpp_bindgen::anon_unknown_0::FortranArrayView_CArrayReferenceIsBindable_Test::TestBody
          (FortranArrayView_CArrayReferenceIsBindable_Test *this)

{
  bool bVar1;
  enable_if_t<std::is_lvalue_reference<float_(&)[1][2][3][4]>::value_&&_std::is_array<remove_reference_t<float_(&)[1][2][3][4]>_>::value_&&_std::is_arithmetic<remove_all_extents_t<remove_reference_t<float_(&)[1][2][3][4]>_>_>::value,_float_(&)[1][2][3][4]>
  lhs;
  char *message;
  AssertionResult gtest_ar;
  bindgen_fortran_array_descriptor descriptor;
  float data [1] [2] [3] [4];
  AssertHelper local_d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertHelper local_b8;
  bindgen_fortran_array_descriptor local_b0;
  undefined1 local_78 [104];
  
  local_b0.type = bindgen_fk_Float;
  local_b0.rank = 4;
  local_b0.dims[0] = 4;
  local_b0.dims[1] = 3;
  local_b0.dims[2] = 2;
  local_b0.dims[3] = 1;
  local_b0.dims[4] = 0;
  local_b0.dims[5] = 0;
  local_b0.dims[6] = 0;
  local_b0.data = local_78;
  local_b0.is_acc_present = false;
  lhs = make_fortran_array_view<float(&)[1][2][3][4]>(&local_b0);
  testing::internal::CmpHelperEQ<float[1][2][3][4],void*>
            ((internal *)&local_c8,"view","descriptor.data",lhs,&local_b0.data);
  if (local_c8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
               ,0x90,message);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_d0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_d0.data_ + 8))();
      }
      local_d0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    make_fortran_array_view<float(&)[1][2][3][3]>(&local_b0);
  }
  testing::Message::Message((Message *)&local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
             ,0x92,
             "Expected: make_fortran_array_view<float(&)[1][2][3][3]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8.ptr_ + 8))();
    }
    local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    make_fortran_array_view<float(&)[2][2][3][4]>(&local_b0);
  }
  testing::Message::Message((Message *)&local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
             ,0x93,
             "Expected: make_fortran_array_view<float(&)[2][2][3][4]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8.ptr_ + 8))();
    }
    local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    make_fortran_array_view<float(&)[1][2][3]>(&local_b0);
  }
  testing::Message::Message((Message *)&local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
             ,0x94,
             "Expected: make_fortran_array_view<float(&)[1][2][3]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8.ptr_ + 8))();
    }
    local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    make_fortran_array_view<float(&)[1][2][3][4][5]>(&local_b0);
  }
  testing::Message::Message((Message *)&local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wdeconinck[P]cpp_bindgen/tests/unit_tests/test_fortran_array_view.cpp"
             ,0x95,
             "Expected: make_fortran_array_view<float(&)[1][2][3][4][5]>(&descriptor) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (((local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_c8.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST(FortranArrayView, CArrayReferenceIsBindable) {
                float data[1][2][3][4];
                bindgen_fortran_array_descriptor descriptor{bindgen_fk_Float, 4, {4, 3, 2, 1}, &data[0]};

                auto &view = make_fortran_array_view<float(&)[1][2][3][4]>(&descriptor);
                static_assert(std::is_same<decltype(view), float(&)[1][2][3][4]>::value, "");
                EXPECT_EQ(view, descriptor.data);

                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3][3]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[2][2][3][4]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3]>(&descriptor), std::runtime_error);
                EXPECT_THROW(make_fortran_array_view<float(&)[1][2][3][4][5]>(&descriptor), std::runtime_error);
            }